

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlerror.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QSqlError *s)

{
  long lVar1;
  QSqlErrorPrivate *pQVar2;
  QDebug *pQVar3;
  QSqlError *in_RDX;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)s);
  *(undefined1 *)&(((s->d).d.ptr)->databaseError).d.size = 0;
  pQVar3 = QDebug::operator<<((QDebug *)s,"QSqlError(");
  QSqlError::nativeErrorCode((QString *)&local_58,in_RDX);
  pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_58);
  pQVar3 = QDebug::operator<<(pQVar3,", ");
  QSqlError::driverText((QString *)&local_70,in_RDX);
  pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_70);
  pQVar3 = QDebug::operator<<(pQVar3,", ");
  QSqlError::databaseText((QString *)&QStack_88,in_RDX);
  pQVar3 = QDebug::operator<<(pQVar3,(QString *)&QStack_88);
  QDebug::operator<<(pQVar3,')');
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar2 = (s->d).d.ptr;
  (s->d).d.ptr = (QSqlErrorPrivate *)0x0;
  *(QSqlErrorPrivate **)dbg.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QSqlError &s)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QSqlError(" << s.nativeErrorCode() << ", " << s.driverText()
        << ", " << s.databaseText() << ')';
    return dbg;
}